

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::initCallbackProcessing(FederateState *this)

{
  IterationRequest iterate;
  uint uVar1;
  ActionMessage bye;
  ActionMessage local_d0;
  
  uVar1 = (*((this->fedCallbacks).
             super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_FederateOperator[2])();
  iterate = (IterationRequest)uVar1;
  if (iterate == HALT_OPERATIONS) {
    ActionMessage::ActionMessage(&local_d0,cmd_disconnect);
    local_d0.source_id.gid = (this->global_id)._M_i.gid;
    local_d0.dest_id.gid = local_d0.source_id.gid;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_d0);
  }
  else if ((uVar1 & 0xff) == 7) {
    ActionMessage::ActionMessage(&local_d0,cmd_local_error);
    local_d0.source_id.gid = (this->global_id)._M_i.gid;
    local_d0.messageID = -0x1d;
    local_d0.dest_id.gid = local_d0.source_id.gid;
    SmallBuffer::operator=
              (&local_d0.payload,
               (char (*) [71])
               "Callback federate unspecified error condition in initializing callback");
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_d0);
  }
  else {
    ActionMessage::ActionMessage(&local_d0,cmd_exec_request);
    local_d0.source_id.gid = (this->global_id)._M_i.gid;
    local_d0.dest_id.gid = (this->global_id)._M_i.gid;
    setIterationFlags(&local_d0,iterate);
    local_d0.flags._0_1_ = (byte)local_d0.flags | 0x20;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_d0);
  }
  ActionMessage::~ActionMessage(&local_d0);
  this->lastIterationRequest = iterate;
  return;
}

Assistant:

void FederateState::initCallbackProcessing()
{
    auto initIter = fedCallbacks->initializeOperations();
    switch (initIter) {
        case IterationRequest::NO_ITERATIONS:
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
        default: {
            ActionMessage exec(CMD_EXEC_REQUEST);
            exec.source_id = global_id.load();
            exec.dest_id = global_id.load();
            setIterationFlags(exec, initIter);
            setActionFlag(exec, indicator_flag);
            mParent->addActionMessage(exec);
        } break;
        case IterationRequest::HALT_OPERATIONS: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            mParent->addActionMessage(bye);
        } break;
        case IterationRequest::ERROR_CONDITION:
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "Callback federate unspecified error condition in initializing callback";
            mParent->addActionMessage(bye);
            break;
    }
    lastIterationRequest = initIter;
}